

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O1

void leveldb::_Test_EncodingOutput::_RunIt(void)

{
  int iStack_1e4;
  size_type sStack_1e0;
  string sStack_1d8;
  Tester TStack_1b8;
  
  sStack_1d8._M_string_length = 0;
  sStack_1d8.field_2._M_local_buf[0] = '\0';
  sStack_1d8._M_dataplus._M_p = (pointer)&sStack_1d8.field_2;
  PutFixed32(&sStack_1d8,0x4030201);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x3b;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  iStack_1e4 = 4;
  sStack_1e0 = sStack_1d8._M_string_length;
  test::Tester::IsEq<int,unsigned_long>(&TStack_1b8,&iStack_1e4,&sStack_1e0);
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x3c;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  sStack_1e0._0_4_ = 1;
  iStack_1e4 = (int)*sStack_1d8._M_dataplus._M_p;
  test::Tester::IsEq<int,int>(&TStack_1b8,(int *)&sStack_1e0,&iStack_1e4);
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x3d;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  sStack_1e0._0_4_ = 2;
  iStack_1e4 = (int)sStack_1d8._M_dataplus._M_p[1];
  test::Tester::IsEq<int,int>(&TStack_1b8,(int *)&sStack_1e0,&iStack_1e4);
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x3e;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  sStack_1e0._0_4_ = 3;
  iStack_1e4 = (int)sStack_1d8._M_dataplus._M_p[2];
  test::Tester::IsEq<int,int>(&TStack_1b8,(int *)&sStack_1e0,&iStack_1e4);
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x3f;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  sStack_1e0 = CONCAT44(sStack_1e0._4_4_,4);
  iStack_1e4 = (int)sStack_1d8._M_dataplus._M_p[3];
  test::Tester::IsEq<int,int>(&TStack_1b8,(int *)&sStack_1e0,&iStack_1e4);
  test::Tester::~Tester(&TStack_1b8);
  sStack_1d8._M_string_length = 0;
  *sStack_1d8._M_dataplus._M_p = '\0';
  PutFixed64(&sStack_1d8,0x807060504030201);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x43;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  iStack_1e4 = 8;
  sStack_1e0 = sStack_1d8._M_string_length;
  test::Tester::IsEq<int,unsigned_long>(&TStack_1b8,&iStack_1e4,&sStack_1e0);
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x44;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  sStack_1e0._0_4_ = 1;
  iStack_1e4 = (int)*sStack_1d8._M_dataplus._M_p;
  test::Tester::IsEq<int,int>(&TStack_1b8,(int *)&sStack_1e0,&iStack_1e4);
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x45;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  sStack_1e0._0_4_ = 2;
  iStack_1e4 = (int)sStack_1d8._M_dataplus._M_p[1];
  test::Tester::IsEq<int,int>(&TStack_1b8,(int *)&sStack_1e0,&iStack_1e4);
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x46;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  sStack_1e0._0_4_ = 3;
  iStack_1e4 = (int)sStack_1d8._M_dataplus._M_p[2];
  test::Tester::IsEq<int,int>(&TStack_1b8,(int *)&sStack_1e0,&iStack_1e4);
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x47;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  sStack_1e0._0_4_ = 4;
  iStack_1e4 = (int)sStack_1d8._M_dataplus._M_p[3];
  test::Tester::IsEq<int,int>(&TStack_1b8,(int *)&sStack_1e0,&iStack_1e4);
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x48;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  sStack_1e0._0_4_ = 5;
  iStack_1e4 = (int)sStack_1d8._M_dataplus._M_p[4];
  test::Tester::IsEq<int,int>(&TStack_1b8,(int *)&sStack_1e0,&iStack_1e4);
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x49;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  sStack_1e0._0_4_ = 6;
  iStack_1e4 = (int)sStack_1d8._M_dataplus._M_p[5];
  test::Tester::IsEq<int,int>(&TStack_1b8,(int *)&sStack_1e0,&iStack_1e4);
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x4a;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  sStack_1e0._0_4_ = 7;
  iStack_1e4 = (int)sStack_1d8._M_dataplus._M_p[6];
  test::Tester::IsEq<int,int>(&TStack_1b8,(int *)&sStack_1e0,&iStack_1e4);
  test::Tester::~Tester(&TStack_1b8);
  TStack_1b8.ok_ = true;
  TStack_1b8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1b8.line_ = 0x4b;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1b8.ss_);
  sStack_1e0 = CONCAT44(sStack_1e0._4_4_,8);
  iStack_1e4 = (int)sStack_1d8._M_dataplus._M_p[7];
  test::Tester::IsEq<int,int>(&TStack_1b8,(int *)&sStack_1e0,&iStack_1e4);
  test::Tester::~Tester(&TStack_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1d8._M_dataplus._M_p != &sStack_1d8.field_2) {
    operator_delete(sStack_1d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Coding, EncodingOutput) {
  std::string dst;
  PutFixed32(&dst, 0x04030201);
  ASSERT_EQ(4, dst.size());
  ASSERT_EQ(0x01, static_cast<int>(dst[0]));
  ASSERT_EQ(0x02, static_cast<int>(dst[1]));
  ASSERT_EQ(0x03, static_cast<int>(dst[2]));
  ASSERT_EQ(0x04, static_cast<int>(dst[3]));

  dst.clear();
  PutFixed64(&dst, 0x0807060504030201ull);
  ASSERT_EQ(8, dst.size());
  ASSERT_EQ(0x01, static_cast<int>(dst[0]));
  ASSERT_EQ(0x02, static_cast<int>(dst[1]));
  ASSERT_EQ(0x03, static_cast<int>(dst[2]));
  ASSERT_EQ(0x04, static_cast<int>(dst[3]));
  ASSERT_EQ(0x05, static_cast<int>(dst[4]));
  ASSERT_EQ(0x06, static_cast<int>(dst[5]));
  ASSERT_EQ(0x07, static_cast<int>(dst[6]));
  ASSERT_EQ(0x08, static_cast<int>(dst[7]));
}